

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O1

void __thiscall Interface::Notify(Interface *this,string *sParams)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  
  poVar1 = this->m_Out;
  if (this->m_Protocol == PROTOCOL_XBOARD) {
    pcVar3 = "# ";
    lVar2 = 2;
  }
  else {
    pcVar3 = "info string ";
    lVar2 = 0xc;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(sParams->_M_dataplus)._M_p,sParams->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

INTERFACE_PROTOTYPE( Notify )
    {
        switch ( m_Protocol )
        {
        case PROTOCOL_XBOARD:
            ( *m_Out ) << "# " << sParams << endl;
            break;

        default:
        case PROTOCOL_UCI:
            ( *m_Out ) << "info string " << sParams << endl;
            break;
        }
    }